

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-messages-react.c
# Opt level: O2

void borg_react(char *msg,char *buf)

{
  size_t sVar1;
  long lVar2;
  char *tmp;
  char *pcVar3;
  int iVar4;
  
  if ((borg_dont_react) || (borg.trait[0x77] != 0)) {
    pcVar3 = "# Ignoring messages.";
  }
  else {
    if (*borg_cfg != 0) {
      pcVar3 = format("> Reacting Msg (%s)",msg);
      borg_note(pcVar3);
    }
    sVar1 = strlen(buf);
    iVar4 = (int)sVar1;
    if (iVar4 == 0) {
      iVar4 = 0;
    }
    else if (buf[iVar4 + -1] == ',') {
      buf[(long)iVar4 + -1] = '\0';
      iVar4 = iVar4 + -1;
    }
    if (borg_msg_num < borg_msg_max) {
      if (borg_msg_len + iVar4 < (int)borg_msg_siz) {
        borg_msg_use[borg_msg_num] = 0;
        lVar2 = (long)borg_msg_len;
        borg_msg_pos[borg_msg_num] = borg_msg_len;
        my_strcpy(borg_msg_buf + lVar2,buf,borg_msg_siz - lVar2);
        borg_msg_len = (short)iVar4 + borg_msg_len + 1;
        borg_msg_num = borg_msg_num + 1;
        return;
      }
      pcVar3 = "too much messages";
    }
    else {
      pcVar3 = "too many messages";
    }
  }
  borg_note(pcVar3);
  return;
}

Assistant:

void borg_react(const char *msg, const char *buf)
{
    int len;

    if (borg_dont_react || borg.trait[BI_ISPARALYZED]) {
        borg_note("# Ignoring messages.");
        return;
    }

    /* Note actual message */
    if (borg_cfg[BORG_VERBOSE])
        borg_note(format("> Reacting Msg (%s)", msg));

    /* Extract length of parsed message */
    len = strlen(buf);

    /* trim off trailing , if there is one, seems to have been introduced to
     * some uniques messages */
    if (len && buf[len - 1] == ',') {
        char *tmp  = (char *)buf; /* cast away const */
        tmp[--len] = 0;
    }

    /* Verify space */
    if (borg_msg_num + 1 > borg_msg_max) {
        borg_note("too many messages");
        return;
    }

    /* Verify space */
    if (borg_msg_len + len + 1 > borg_msg_siz) {
        borg_note("too much messages");
        return;
    }

    /* Assume not used yet */
    borg_msg_use[borg_msg_num] = 0;

    /* Save the message position */
    borg_msg_pos[borg_msg_num] = borg_msg_len;

    /* Save the message text */
    my_strcpy(borg_msg_buf + borg_msg_len, buf, borg_msg_siz - borg_msg_len);

    /* Advance the buf */
    borg_msg_len += len + 1;

    /* Advance the pos */
    borg_msg_num++;
}